

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

uint32_t readindex(HunkInfo *hi)

{
  uint16_t uVar1;
  long lVar2;
  long in_RDI;
  uint16_t w;
  
  lVar2 = *(long *)(in_RDI + 0x40) + -2;
  *(long *)(in_RDI + 0x40) = lVar2;
  if (lVar2 < 0) {
    error(0xd,*(undefined8 *)(in_RDI + 0x18));
  }
  uVar1 = read16be(*(void **)(in_RDI + 0x38));
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 2;
  return (uint32_t)uVar1;
}

Assistant:

static uint32_t readindex(struct HunkInfo *hi)
{
  uint16_t w;

  if ((hi->indexcnt -= sizeof(uint16_t)) < 0)
    error(13,hi->filename);  /* File format corrupted */
  w = read16be(hi->indexptr);
  hi->indexptr += sizeof(uint16_t);
  return w;
}